

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examples.cpp
# Opt level: O1

int main(void)

{
  long *plVar1;
  vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_> local_68;
  undefined1 local_50 [8];
  LargeGapGrayCode lggc;
  
  LargeGapGrayCode::LargeGapGrayCode((LargeGapGrayCode *)local_50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "####################################################################",0x44);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "####### 1)  Printing statistics for all Large-Gap Gray Codes #######",0x44);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "####################################################################",0x44);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  LargeGapGrayCode::printAllStatistics((LargeGapGrayCode *)local_50);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "####################################################################",0x44);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "#######  2)  Printing statistics for different 16-bit codes  #######",0x44);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "####################################################################",0x44);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  LargeGapGrayCode::printStatisticsHeader((LargeGapGrayCode *)local_50);
  LargeGapGrayCode::createCodeFromTheorem1((LargeGapGrayCode *)local_50,0xe,2,3,1);
  LargeGapGrayCode::printStatistics((LargeGapGrayCode *)local_50,0x10);
  LargeGapGrayCode::createCodeFromTheorem1((LargeGapGrayCode *)local_50,8,8,0x81,0x7f);
  LargeGapGrayCode::printStatistics((LargeGapGrayCode *)local_50,0x10);
  LargeGapGrayCode::createCodeFromTheorem1((LargeGapGrayCode *)local_50,9,7,0x41,0x3f);
  LargeGapGrayCode::printStatistics((LargeGapGrayCode *)local_50,0x10);
  LargeGapGrayCode::createCodeFromTheorem1((LargeGapGrayCode *)local_50,0xb,5,0x15,0xb);
  LargeGapGrayCode::printStatistics((LargeGapGrayCode *)local_50,0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "####################################################################",0x44);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "#######       3)  Printing generated 7-bit binary code       #######",0x44);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "#######             Note: MinGap = 5 and MaxGap = 11         #######",0x44);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "####################################################################",0x44);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  LargeGapGrayCode::getBinaryCode(&local_68,(LargeGapGrayCode *)local_50,7);
  printBinaryCode(&local_68,7);
  if (local_68.super__Vector_base<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  LargeGapGrayCode::~LargeGapGrayCode((LargeGapGrayCode *)local_50);
  return 0;
}

Assistant:

int main() {
	LargeGapGrayCode lggc;
	std::cout << "####################################################################" << std::endl;
	std::cout << "####### 1)  Printing statistics for all Large-Gap Gray Codes #######" << std::endl;
	std::cout << "####################################################################" << std::endl << std::endl;
	lggc.printAllStatistics();

	std::cout << std::endl << std::endl;
	std::cout << "####################################################################" << std::endl;
	std::cout << "#######  2)  Printing statistics for different 16-bit codes  #######" << std::endl;
	std::cout << "####################################################################" << std::endl << std::endl;
	lggc.printStatisticsHeader();
	lggc.createCodeFromTheorem1(14, 2, 3, 1);
	lggc.printStatistics(16);
	lggc.createCodeFromTheorem1(8, 8, 129, 127);
	lggc.printStatistics(16);
	lggc.createCodeFromTheorem1(9, 7, 65, 63);
	lggc.printStatistics(16);
	lggc.createCodeFromTheorem1(11, 5, 21, 11);
	lggc.printStatistics(16);

	std::cout << std::endl << std::endl;
	std::cout << "####################################################################" << std::endl;
	std::cout << "#######       3)  Printing generated 7-bit binary code       #######" << std::endl;
	std::cout << "#######             Note: MinGap = 5 and MaxGap = 11         #######" << std::endl;
	std::cout << "####################################################################" << std::endl << std::endl;
	printBinaryCode(lggc.getBinaryCode(7), 7);

	return 0;
}